

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O2

string * __thiscall
t_swift_generator::declare_property_abi_cxx11_
          (string *__return_storage_ptr__,t_swift_generator *this,t_field *tfield,bool is_private)

{
  bool bVar1;
  ostream *poVar2;
  undefined7 in_register_00000009;
  char *pcVar3;
  char *pcVar4;
  string sStack_1d8;
  string visibility;
  ostringstream render;
  
  pcVar3 = "fileprivate";
  if ((this->gen_cocoa_ & 1U) != 0) {
    pcVar3 = "private";
  }
  pcVar4 = "public";
  if ((int)CONCAT71(in_register_00000009,is_private) != 0) {
    pcVar4 = pcVar3;
  }
  std::__cxx11::string::string((string *)&visibility,pcVar4,(allocator *)&render);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&render);
  poVar2 = std::operator<<(&render.super_basic_ostream<char,_std::char_traits<char>_>,
                           (string *)&visibility);
  poVar2 = std::operator<<(poVar2," var ");
  maybe_escape_identifier(&sStack_1d8,this,&tfield->name_);
  std::operator<<(poVar2,(string *)&sStack_1d8);
  std::__cxx11::string::~string((string *)&sStack_1d8);
  bVar1 = field_is_optional(this,tfield);
  if (bVar1) {
    pcVar3 = "";
    if (this->gen_cocoa_ != false) {
      pcVar3 = " ";
    }
    poVar2 = std::operator<<(&render.super_basic_ostream<char,_std::char_traits<char>_>,pcVar3);
    poVar2 = std::operator<<(poVar2,": ");
    type_name_abi_cxx11_(&sStack_1d8,this,tfield->type_,true,false);
    std::operator<<(poVar2,(string *)&sStack_1d8);
  }
  else if (this->gen_cocoa_ == false) {
    poVar2 = std::operator<<(&render.super_basic_ostream<char,_std::char_traits<char>_>,": ");
    type_name_abi_cxx11_(&sStack_1d8,this,tfield->type_,false,false);
    std::operator<<(poVar2,(string *)&sStack_1d8);
  }
  else {
    poVar2 = std::operator<<(&render.super_basic_ostream<char,_std::char_traits<char>_>," = ");
    type_name_abi_cxx11_(&sStack_1d8,this,tfield->type_,false,false);
    poVar2 = std::operator<<(poVar2,(string *)&sStack_1d8);
    std::operator<<(poVar2,"()");
  }
  std::__cxx11::string::~string((string *)&sStack_1d8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&render);
  std::__cxx11::string::~string((string *)&visibility);
  return __return_storage_ptr__;
}

Assistant:

string t_swift_generator::declare_property(t_field* tfield, bool is_private) {

  string visibility = is_private ? (gen_cocoa_ ? "private" : "fileprivate") : "public";

  ostringstream render;

  render << visibility << " var " << maybe_escape_identifier(tfield->get_name());

  if (field_is_optional(tfield)) {
    render << (gen_cocoa_ ? " " : "") << ": " << type_name(tfield->get_type(), true);
  }
  else {
    if (!gen_cocoa_) {
      render << ": " << type_name(tfield->get_type(), false);
    } else {
      // Swift2/Cocoa backward compat, Bad, default init
      render << " = " << type_name(tfield->get_type(), false) << "()";
    }
  }

  return render.str();
}